

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O1

int check_token(Context_conflict *ctx,char *str)

{
  char *__s1;
  int iVar1;
  size_t __n;
  int iVar2;
  
  __n = strlen(str);
  iVar2 = 0;
  if (__n == ctx->tokenlen) {
    __s1 = ctx->token;
    iVar1 = strncasecmp(__s1,str,__n);
    iVar2 = 0;
    if (iVar1 == 0) {
      ctx->token = __s1 + __n;
      ctx->tokenlen = 0;
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

static int check_token(Context *ctx, const char *str)
{
    const size_t len = strlen(str);
    if ( (ctx->tokenlen != len) || (strncasecmp(ctx->token, str, len) != 0) )
        return 0;
    ctx->token += len;
    ctx->tokenlen = 0;
    return 1;
}